

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O3

void __thiscall MPLSParser::parseExtensionData(MPLSParser *this,uint8_t *data,uint8_t *dataEnd)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint dataLen;
  BitStreamReader reader;
  int local_60;
  BitStreamReader local_50;
  
  local_50.super_BitStream.m_totalBits = 0;
  local_50.super_BitStream.m_buffer = (uint *)0x0;
  local_50.super_BitStream.m_initBuffer = (uint *)0x0;
  local_50.m_curVal = 0;
  local_50.m_bitLeft = 0;
  BitStream::setBuffer(&local_50.super_BitStream,data,dataEnd);
  local_50._24_8_ = local_50._24_8_ & 0xffffffff;
  local_50.m_curVal = BitStreamReader::getCurVal(&local_50,local_50.super_BitStream.m_buffer);
  local_50.m_bitLeft = 0x20;
  uVar1 = BitStreamReader::getBits(&local_50,0x20);
  if (uVar1 != 0) {
    BitStreamReader::skipBits(&local_50,0x20);
    BitStreamReader::skipBits(&local_50,0x18);
    uVar1 = BitStreamReader::getBits(&local_50,8);
    uVar1 = uVar1 & 0xff;
    if (uVar1 != 0) {
      local_60 = (int)data;
      do {
        uVar2 = BitStreamReader::getBits(&local_50,0x20);
        uVar3 = BitStreamReader::getBits(&local_50,0x20);
        dataLen = BitStreamReader::getBits(&local_50,0x20);
        if ((uint)((int)dataEnd - local_60) < dataLen + uVar3) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Invalid playlist extension entry skipped.",0x29);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
          std::ostream::put('\x10');
          std::ostream::flush();
          sLastMsg = true;
        }
        else if (uVar2 == 0x20002) {
          this->isDependStreamExist = true;
          parseSubPathEntryExtension(this,data + uVar3,dataLen);
        }
        else if (uVar2 == 0x20001) {
          this->isDependStreamExist = true;
          parseStnTableSS(this,data + uVar3,dataLen);
        }
        uVar1 = uVar1 - 1;
      } while (uVar1 != 0);
    }
  }
  return;
}

Assistant:

void MPLSParser::parseExtensionData(uint8_t* data, const uint8_t* dataEnd)
{
    try
    {
        BitStreamReader reader{};
        reader.setBuffer(data, dataEnd);
        if (reader.getBits(32) == 0)  // length
            return;

        reader.skipBits(32);  // data_block_start_address
        reader.skipBits(24);
        const auto entries = reader.getBits<uint8_t>(8);
        for (int i = 0; i < entries; ++i)
        {
            const uint32_t dataID = reader.getBits(32);
            const uint32_t dataAddress = reader.getBits(32);
            const uint32_t dataLength = reader.getBits(32);

            if (dataAddress + dataLength > static_cast<uint32_t>(dataEnd - data))
            {
                LTRACE(LT_WARN, 2, "Invalid playlist extension entry skipped.");
                continue;
            }

            if (dataAddress + dataLength > static_cast<uint32_t>(dataEnd - data))
                continue;  // invalid entry

            switch (dataID)
            {
            case 0x00020001:
                // stn table ss
                isDependStreamExist = true;
                parseStnTableSS(data + dataAddress, dataLength);
                break;
            case 0x00020002:
                // stn table ss
                isDependStreamExist = true;
                parseSubPathEntryExtension(data + dataAddress, dataLength);
                break;
            default:;
            }
        }
    }
    catch (...)
    {
    }
}